

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O3

void sysbvm_namespace_setNewSymbolBindingWithValue
               (sysbvm_context_t *context,sysbvm_tuple_t nspace,sysbvm_tuple_t symbol,
               sysbvm_tuple_t value)

{
  ulong uVar1;
  uint uVar2;
  sysbvm_tuple_t binding;
  
  if (nspace == 0 || (nspace & 0xf) != 0) {
    sysbvm_error("Expected a namespace.");
  }
  binding = sysbvm_symbolValueBinding_createWithFlags(context,0,symbol,value,false,false,false);
  sysbvm_environment_setNewBinding(context,nspace,binding);
  if ((((value & 0xf) == 0 && value != 0) &&
      (uVar1 = *(ulong *)value, (uVar1 & 0xf) == 0 && uVar1 != 0)) &&
     ((*(byte *)(uVar1 + 8) & 0x80) == 0)) {
    uVar1 = *(ulong *)(uVar1 + 0x70);
    if (uVar1 == 0 || (uVar1 & 0xf) != 0) {
      uVar2 = (uint)((long)uVar1 >> 4);
    }
    else {
      uVar2 = (uint)*(undefined8 *)(uVar1 + 0x10);
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      sysbvm_function_recordBindingWithOwnerAndName(context,value,nspace,symbol);
      return;
    }
  }
  sysbvm_programEntity_recordBindingWithOwnerAndName(context,value,nspace,symbol);
  return;
}

Assistant:

SYSBVM_API void sysbvm_namespace_setNewSymbolBindingWithValue(sysbvm_context_t *context, sysbvm_tuple_t nspace, sysbvm_tuple_t symbol, sysbvm_tuple_t value)
{
    if(!sysbvm_tuple_isNonNullPointer(nspace))
        sysbvm_error("Expected a namespace.");

    sysbvm_tuple_t binding = sysbvm_symbolValueBinding_create(context, SYSBVM_NULL_TUPLE, symbol, value);
    sysbvm_environment_setNewBinding(context, nspace, binding);

    if(sysbvm_tuple_isFunction(context, value))
        sysbvm_function_recordBindingWithOwnerAndName(context, value, nspace, symbol);
    else
        sysbvm_programEntity_recordBindingWithOwnerAndName(context, value, nspace, symbol);
}